

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

tsize_t __thiscall
TIFFImageHandler::SampleABGRToRGB(TIFFImageHandler *this,tdata_t inData,uint32_t inSampleCount)

{
  undefined4 uVar1;
  undefined4 local_20;
  uint32_t sample;
  uint32_t i;
  uint32_t inSampleCount_local;
  tdata_t inData_local;
  TIFFImageHandler *this_local;
  
  for (local_20 = 0; local_20 < inSampleCount; local_20 = local_20 + 1) {
    uVar1 = *(undefined4 *)((long)inData + (ulong)local_20 * 4);
    *(char *)((long)inData + (ulong)(local_20 * 3)) = (char)uVar1;
    *(char *)((long)inData + (ulong)(local_20 * 3 + 1)) = (char)((uint)uVar1 >> 8);
    *(char *)((long)inData + (ulong)(local_20 * 3 + 2)) = (char)((uint)uVar1 >> 0x10);
  }
  return (ulong)(local_20 * 3);
}

Assistant:

tsize_t TIFFImageHandler::SampleABGRToRGB(tdata_t inData, uint32_t inSampleCount)
{
	uint32_t i=0;
	uint32_t sample=0;
	
	for(i=0;i<inSampleCount;i++)
	{
		sample=((uint32_t*)inData)[i];
		((char*)inData)[i*3]= (char) (sample & 0xff);
		((char*)inData)[i*3+1]= (char) ((sample>>8) & 0xff);
		((char*)inData)[i*3+2]= (char) ((sample>>16) & 0xff);
	}

	return(i*3);	
}